

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O2

int ecx_SDOwrite(ecx_contextt *context,uint16 Slave,uint16 Index,uint8 SubIndex,boolean CA,int psize
                ,void *p,int Timeout)

{
  ec_slavet *peVar1;
  uint8 uVar2;
  byte bVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  undefined6 in_register_00000032;
  undefined7 in_register_00000081;
  ulong uVar11;
  uint uVar12;
  void *local_858;
  ec_mbxbuft MbxIn;
  ec_mbxbuft MbxOut;
  
  uVar11 = CONCAT62(in_register_00000032,Slave) & 0xffffffff;
  ec_clearmbx(&MbxIn);
  ecx_mbxreceive(context,(uint16)uVar11,&MbxIn,0);
  ec_clearmbx(&MbxOut);
  peVar1 = context->slavelist;
  MbxOut._9_2_ = Index;
  if ((int)CONCAT71(in_register_00000081,CA) == 0 && psize < 5) {
    MbxOut[0] = '\n';
    MbxOut[1] = '\0';
    MbxOut[2] = '\0';
    MbxOut[3] = '\0';
    MbxOut[4] = '\0';
    uVar2 = ec_nextmbxcnt(peVar1[uVar11].mbx_cnt);
    context->slavelist[uVar11].mbx_cnt = uVar2;
    MbxOut[5] = uVar2 << 4 | 3;
    MbxOut[6] = '\0';
    MbxOut[7] = ' ';
    MbxOut[8] = (-(char)psize & 3U) << 2 | 0x23;
    MbxOut[0xb] = SubIndex;
    memcpy(MbxOut + 0xc,p,(long)psize);
    iVar5 = ecx_mbxsend(context,Slave,&MbxOut,20000);
    if (iVar5 < 1) {
      return iVar5;
    }
    ec_clearmbx(&MbxIn);
    iVar5 = ecx_mbxreceive(context,Slave,&MbxIn,Timeout);
    if (iVar5 < 1) {
      return iVar5;
    }
    if (((((MbxIn[5] & 0xf) == 3) && ((MbxIn._6_2_ & 0xf000) == 0x3000)) &&
        (MbxIn._9_2_ == MbxOut._9_2_)) && (MbxIn[0xb] == MbxOut[0xb])) {
      return iVar5;
    }
  }
  else {
    uVar4 = peVar1[uVar11].mbx_l;
    uVar9 = uVar4 - 0x10;
    uVar6 = uVar9;
    if ((int)(psize & 0xffffU) <= (int)uVar9) {
      uVar6 = psize;
    }
    bVar8 = (int)uVar9 < (int)(psize & 0xffffU);
    uVar9 = uVar6 & 0xffff;
    MbxOut[2] = '\0';
    MbxOut[3] = '\0';
    MbxOut._0_2_ = (short)uVar6 + 10;
    MbxOut[4] = '\0';
    uVar2 = ec_nextmbxcnt(peVar1[uVar11].mbx_cnt);
    context->slavelist[uVar11].mbx_cnt = uVar2;
    MbxOut[5] = uVar2 << 4 | 3;
    MbxOut[0xb] = SubIndex != '\0';
    MbxOut[6] = '\0';
    MbxOut[7] = ' ';
    if (CA == '\0') {
      MbxOut[0xb] = SubIndex;
    }
    MbxOut[8] = (CA != '\0') << 4 | 0x21;
    MbxOut._12_4_ = psize;
    memcpy(MbxOut + 0x10,p,(ulong)uVar9);
    iVar5 = ecx_mbxsend(context,Slave,&MbxOut,20000);
    if (iVar5 < 1) {
      return iVar5;
    }
    ec_clearmbx(&MbxIn);
    iVar5 = ecx_mbxreceive(context,Slave,&MbxIn,Timeout);
    if (iVar5 < 1) {
      return iVar5;
    }
    if ((((MbxIn[5] & 0xf) == 3) && ((MbxIn._6_2_ & 0xf000) == 0x3000)) &&
       ((MbxIn._9_2_ == MbxOut._9_2_ && (MbxIn[0xb] == MbxOut[0xb])))) {
      local_858 = (void *)((long)p + (ulong)uVar9);
      uVar9 = psize - uVar9;
      uVar6 = uVar4 - 9;
      bVar3 = 0;
      while (bVar8) {
        uVar10 = uVar9 & 0xffff;
        uVar7 = uVar6;
        if ((int)uVar10 <= (int)uVar6) {
          uVar7 = uVar9;
        }
        uVar12 = uVar7 & 0xffff;
        bVar8 = (int)uVar6 < (int)uVar10;
        MbxOut[8] = (int)uVar10 <= (int)uVar6;
        if (((int)uVar6 < (int)uVar10) || (6 < uVar12)) {
          uVar4 = (short)uVar7 + 3;
        }
        else {
          MbxOut[8] = (char)uVar7 * -2 + '\x0f';
          uVar4 = 10;
        }
        MbxOut[2] = '\0';
        MbxOut[3] = '\0';
        MbxOut[0] = (char)uVar4;
        MbxOut[1] = (char)(uVar4 >> 8);
        MbxOut[4] = '\0';
        uVar2 = ec_nextmbxcnt(context->slavelist[uVar11].mbx_cnt);
        context->slavelist[uVar11].mbx_cnt = uVar2;
        MbxOut[5] = uVar2 << 4 | 3;
        MbxOut[6] = '\0';
        MbxOut[7] = ' ';
        MbxOut[8] = MbxOut[8] + bVar3;
        memcpy(MbxOut + 9,local_858,(ulong)uVar12);
        iVar5 = ecx_mbxsend(context,Slave,&MbxOut,20000);
        if (0 < iVar5) {
          ec_clearmbx(&MbxIn);
          iVar5 = ecx_mbxreceive(context,Slave,&MbxIn,Timeout);
          if ((0 < iVar5) &&
             (((MbxIn[5] & 0xf) != 3 ||
              ((MbxIn._6_2_ & 0xf000) != 0x3000 || (MbxIn[8] & 0xe0) != 0x20)))) {
            ecx_packeterror(context,Slave,Index,SubIndex,1);
            iVar5 = 0;
            bVar8 = false;
          }
        }
        local_858 = (void *)((long)local_858 + (ulong)uVar12);
        uVar9 = uVar9 - uVar12;
        bVar3 = bVar3 ^ 0x10;
      }
      return iVar5;
    }
  }
  ecx_packeterror(context,Slave,Index,SubIndex,1);
  return 0;
}

Assistant:

int ecx_SDOwrite(ecx_contextt *context, uint16 Slave, uint16 Index, uint8 SubIndex,
                boolean CA, int psize, void *p, int Timeout)
{
   ec_SDOt *SDOp, *aSDOp;
   int wkc, maxdata;
   ec_mbxbuft MbxIn, MbxOut;
   uint8 cnt, toggle;
   uint16 framedatasize;
   boolean  NotLast;
   uint8 *hp;

   ec_clearmbx(&MbxIn);
   /* Empty slave out mailbox if something is in. Timout set to 0 */
   wkc = ecx_mbxreceive(context, Slave, (ec_mbxbuft *)&MbxIn, 0);
   ec_clearmbx(&MbxOut);
   aSDOp = (ec_SDOt *)&MbxIn;
   SDOp = (ec_SDOt *)&MbxOut;
   maxdata = context->slavelist[Slave].mbx_l - 0x10; /* data section=mailbox size - 6 mbx - 2 CoE - 8 sdo req */
   /* if small data use expedited transfer */
   if ((psize <= 4) && !CA)
   {
      SDOp->MbxHeader.length = htoes(0x000a);
      SDOp->MbxHeader.address = htoes(0x0000);
      SDOp->MbxHeader.priority = 0x00;
      /* get new mailbox counter, used for session handle */
      cnt = ec_nextmbxcnt(context->slavelist[Slave].mbx_cnt);
      context->slavelist[Slave].mbx_cnt = cnt;
      SDOp->MbxHeader.mbxtype = ECT_MBXT_COE + (cnt << 4); /* CoE */
      SDOp->CANOpen = htoes(0x000 + (ECT_COES_SDOREQ << 12)); /* number 9bits service upper 4 bits */
      SDOp->Command = ECT_SDO_DOWN_EXP | (((4 - psize) << 2) & 0x0c); /* expedited SDO download transfer */
      SDOp->Index = htoes(Index);
      SDOp->SubIndex = SubIndex;
      hp = p;
      /* copy parameter data to mailbox */
      memcpy(&SDOp->ldata[0], hp, psize);
      /* send mailbox SDO download request to slave */
      wkc = ecx_mbxsend(context, Slave, (ec_mbxbuft *)&MbxOut, EC_TIMEOUTTXM);
      if (wkc > 0)
      {
         ec_clearmbx(&MbxIn);
         /* read slave response */
         wkc = ecx_mbxreceive(context, Slave, (ec_mbxbuft *)&MbxIn, Timeout);
         if (wkc > 0)
         {
            /* response should be CoE, SDO response, correct index and subindex */
            if (((aSDOp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_COE) && 
                ((etohs(aSDOp->CANOpen) >> 12) == ECT_COES_SDORES) &&
                 (aSDOp->Index == SDOp->Index) &&
                 (aSDOp->SubIndex == SDOp->SubIndex))
            {
                 /* all OK */
            }
            /* unexpected response from slave */
            else
            {
               if (aSDOp->Command == ECT_SDO_ABORT) /* SDO abort frame received */
               {
                  ecx_SDOerror(context, Slave, Index, SubIndex, etohl(aSDOp->ldata[0]));
               }
               else
               {
                  ecx_packeterror(context, Slave, Index, SubIndex, 1); /* Unexpected frame returned */
               }
               wkc = 0;
            }
         }
      }
   }
   else
   {
      framedatasize = psize;
      NotLast = FALSE;
      if (framedatasize > maxdata)
      {
         framedatasize = maxdata;  /*  segmented transfer needed  */
         NotLast = TRUE;
      }
      SDOp->MbxHeader.length = htoes(0x0a + framedatasize);
      SDOp->MbxHeader.address = htoes(0x0000);
      SDOp->MbxHeader.priority = 0x00;
      /* get new mailbox counter, used for session handle */
      cnt = ec_nextmbxcnt(context->slavelist[Slave].mbx_cnt);
      context->slavelist[Slave].mbx_cnt = cnt;
      SDOp->MbxHeader.mbxtype = ECT_MBXT_COE + (cnt << 4); /* CoE */
      SDOp->CANOpen = htoes(0x000 + (ECT_COES_SDOREQ << 12)); /* number 9bits service upper 4 bits */
      if (CA)
      {
         SDOp->Command = ECT_SDO_DOWN_INIT_CA; /* Complete Access, normal SDO init download transfer */
      }
      else
      {
         SDOp->Command = ECT_SDO_DOWN_INIT; /* normal SDO init download transfer */
      }
      SDOp->Index = htoes(Index);
      SDOp->SubIndex = SubIndex;
      if (CA && (SubIndex > 1))
      {
         SDOp->SubIndex = 1;
      }
      SDOp->ldata[0] = htoel(psize);
      hp = p;
      /* copy parameter data to mailbox */
      memcpy(&SDOp->ldata[1], hp, framedatasize);
      hp += framedatasize;
      psize -= framedatasize;
      /* send mailbox SDO download request to slave */
      wkc = ecx_mbxsend(context, Slave, (ec_mbxbuft *)&MbxOut, EC_TIMEOUTTXM);
      if (wkc > 0)
      {
         ec_clearmbx(&MbxIn);
         /* read slave response */
         wkc = ecx_mbxreceive(context, Slave, (ec_mbxbuft *)&MbxIn, Timeout);
         if (wkc > 0)
         {
            /* response should be CoE, SDO response, correct index and subindex */
            if (((aSDOp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_COE) && 
                ((etohs(aSDOp->CANOpen) >> 12) == ECT_COES_SDORES) &&
                 (aSDOp->Index == SDOp->Index) &&
                 (aSDOp->SubIndex == SDOp->SubIndex))
            {
               /* all ok */
               maxdata += 7;
               toggle = 0;
               /* repeat while segments left */
               while (NotLast)
               {
                  SDOp = (ec_SDOt *)&MbxOut;
                  framedatasize = psize;
                  NotLast = FALSE;
                  SDOp->Command = 0x01; /* last segment */
                  if (framedatasize > maxdata)
                  {
                     framedatasize = maxdata;  /*  more segments needed  */
                     NotLast = TRUE;
                     SDOp->Command = 0x00; /* segments follow */
                  }
                  if (!NotLast && (framedatasize < 7))
                  {
                     SDOp->MbxHeader.length = htoes(0x0a); /* minimum size */
                     SDOp->Command = 0x01 + ((7 - framedatasize) << 1); /* last segment reduced octets */
                  }
                  else
                  {
                     SDOp->MbxHeader.length = htoes(framedatasize + 3); /* data + 2 CoE + 1 SDO */
                  }
                  SDOp->MbxHeader.address = htoes(0x0000);
                  SDOp->MbxHeader.priority = 0x00;
                  /* get new mailbox counter value */
                  cnt = ec_nextmbxcnt(context->slavelist[Slave].mbx_cnt);
                  context->slavelist[Slave].mbx_cnt = cnt;
                  SDOp->MbxHeader.mbxtype = ECT_MBXT_COE + (cnt << 4); /* CoE */
                  SDOp->CANOpen = htoes(0x000 + (ECT_COES_SDOREQ << 12)); /* number 9bits service upper 4 bits (SDO request) */
                  SDOp->Command = SDOp->Command + toggle; /* add toggle bit to command byte */
                  /* copy parameter data to mailbox */
                  memcpy(&SDOp->Index, hp, framedatasize);
                  /* update parameter buffer pointer */
                  hp += framedatasize;
                  psize -= framedatasize;
                  /* send SDO download request */
                  wkc = ecx_mbxsend(context, Slave, (ec_mbxbuft *)&MbxOut, EC_TIMEOUTTXM);
                  if (wkc > 0)
                  {
                     ec_clearmbx(&MbxIn);
                     /* read slave response */
                     wkc = ecx_mbxreceive(context, Slave, (ec_mbxbuft *)&MbxIn, Timeout);
                     if (wkc > 0)
                     {
                        if (((aSDOp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_COE) &&
                            ((etohs(aSDOp->CANOpen) >> 12) == ECT_COES_SDORES) &&
                            ((aSDOp->Command & 0xe0) == 0x20))
                        {
                                   /* all OK, nothing to do */
                        }
                        else
                        {
                           if (aSDOp->Command == ECT_SDO_ABORT) /* SDO abort frame received */
                           {
                              ecx_SDOerror(context, Slave, Index, SubIndex, etohl(aSDOp->ldata[0]));
                           }
                           else
                           {
                              ecx_packeterror(context, Slave, Index, SubIndex, 1); /* Unexpected frame returned */
                           }
                           wkc = 0;
                           NotLast = FALSE;
                        }
                     }
                  }
                  toggle = toggle ^ 0x10; /* toggle bit for segment request */
               }
            }
            /* unexpected response from slave */
            else
            {
               if (aSDOp->Command == ECT_SDO_ABORT) /* SDO abort frame received */
               {
                  ecx_SDOerror(context, Slave, Index, SubIndex, etohl(aSDOp->ldata[0]));
               }
               else
               {
                  ecx_packeterror(context, Slave, Index, SubIndex, 1); /* Unexpected frame returned */
               }
               wkc = 0;
            }
         }
      }
   }

   return wkc;
}